

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ulong uVar1;
  ExprList_item *pEVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iCur;
  sqlite3 *psVar8;
  char *zLeft;
  bool bVar9;
  bool bVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  WhereTerm *pWVar16;
  CollSeq *pCVar17;
  Bitmask BVar18;
  ulong uVar19;
  short sVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  WhereLoop *pWVar24;
  Expr *pEVar25;
  ExprList_item *pEVar26;
  ulong uVar27;
  undefined6 in_register_00000082;
  ulong uVar28;
  Index *pIVar29;
  bool bVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  ulong local_d8;
  ulong local_b8;
  ulong local_a8;
  Walker local_60;
  
  psVar8 = pWInfo->pParse->db;
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) || ((psVar8->dbOptFlags & 0x80) == 0)) {
    uVar5 = (ushort)pOrderBy->nExpr;
    uVar21 = (ulong)uVar5;
    uVar19 = 0;
    if (uVar5 < 0x40) {
      uVar15 = ~(-1L << ((byte)uVar5 & 0x3f));
      uVar12 = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      if (uVar5 != 0) {
        pEVar2 = pOrderBy->a;
        bVar34 = true;
        local_d8 = 0;
        local_b8 = 0;
        uVar28 = 0;
        pWVar24 = (WhereLoop *)0x0;
        uVar19 = 0;
        do {
          if (uVar19 != 0) {
            local_d8 = local_d8 | pWVar24->maskSelf;
          }
          pWVar24 = pLast;
          if ((nLoop <= uVar19) || (pWVar24 = pPath->aLoop[uVar19], (wctrlFlags >> 0xb & 1) == 0)) {
            if ((pWVar24->wsFlags & 0x400) != 0) {
              if ((pWVar24->u).vtab.isOrdered != '\0') {
                uVar28 = uVar15;
              }
              goto LAB_0024da02;
            }
            (pWVar24->u).btree.nIdxCol = 0;
            iCur = pWInfo->pTabList->a[pWVar24->iTab].iCursor;
            uVar31 = 0;
            do {
              if ((uVar28 >> (uVar31 & 0x3f) & 1) == 0) {
                pEVar25 = pEVar2[uVar31].pExpr;
                while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
                  if ((pEVar25->flags >> 0x12 & 1) == 0) {
                    pEVar26 = (ExprList_item *)&pEVar25->pLeft;
                  }
                  else {
                    pEVar26 = ((pEVar25->x).pList)->a;
                  }
                  pEVar25 = pEVar26->pExpr;
                }
                if (((pEVar25->op == 0x98) && (pEVar25->iTable == iCur)) &&
                   (pWVar16 = sqlite3WhereFindTerm
                                        (&pWInfo->sWC,iCur,(int)pEVar25->iColumn,~local_d8,uVar12,
                                         (Index *)0x0), pWVar16 != (WhereTerm *)0x0)) {
                  if (pWVar16->eOperator == 1) {
                    uVar32 = (ulong)pWVar24->nLTerm;
                    bVar33 = uVar32 != 0;
                    if (bVar33) {
                      if (pWVar16 != *pWVar24->aLTerm) {
                        uVar27 = 0;
                        do {
                          if (uVar32 - 1 == uVar27) goto LAB_0024d4d8;
                          uVar1 = uVar27 + 1;
                          lVar11 = uVar27 + 1;
                          uVar27 = uVar1;
                        } while (pWVar16 != pWVar24->aLTerm[lVar11]);
                        bVar33 = uVar1 < uVar32;
                      }
                      if (bVar33) goto LAB_0024d457;
                    }
                  }
                  else {
LAB_0024d457:
                    if (((pWVar16->eOperator & 0x82) != 0) && (-1 < pEVar25->iColumn)) {
                      pCVar17 = sqlite3ExprCollSeq(pWInfo->pParse,pEVar2[uVar31].pExpr);
                      if (pCVar17 == (CollSeq *)0x0) {
                        pCVar17 = psVar8->pDfltColl;
                      }
                      zLeft = pCVar17->zName;
                      pCVar17 = sqlite3ExprCollSeq(pWInfo->pParse,pWVar16->pExpr);
                      if (pCVar17 == (CollSeq *)0x0) {
                        pCVar17 = psVar8->pDfltColl;
                      }
                      iVar13 = sqlite3StrICmp(zLeft,pCVar17->zName);
                      if (iVar13 != 0) goto LAB_0024d4d8;
                    }
                    uVar28 = uVar28 | 1L << ((byte)uVar31 & 0x3f);
                  }
                }
              }
LAB_0024d4d8:
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar5);
            if ((pWVar24->wsFlags >> 0xc & 1) == 0) {
              if ((pWVar24->wsFlags >> 8 & 1) == 0) {
                pIVar29 = (pWVar24->u).btree.pIndex;
                if ((pIVar29 == (Index *)0x0) || ((pIVar29->field_0x63 & 4) != 0))
                goto LAB_0024da41;
                local_a8 = (ulong)pIVar29->nKeyCol;
                uVar14 = (uint)pIVar29->nColumn;
                bVar34 = pIVar29->onError != '\0';
              }
              else {
                uVar14 = 1;
                pIVar29 = (Index *)0x0;
                local_a8 = 0;
              }
              if (uVar14 == 0) {
                bVar33 = true;
              }
              else {
                uVar31 = 0;
                bVar10 = false;
                bVar22 = 0;
                bVar33 = false;
                do {
                  uVar6 = (pWVar24->u).btree.nEq;
                  bVar9 = true;
                  if ((uVar31 < uVar6) && (pWVar24->nSkip <= uVar31)) {
                    pWVar16 = pWVar24->aLTerm[uVar31];
                    uVar7 = pWVar16->eOperator;
                    if ((uVar12 & uVar7) == 0) {
                      bVar9 = true;
                      if ((uVar7 & 1) != 0) {
                        uVar32 = uVar31;
                        do {
                          if (uVar6 - 1 == uVar32) goto LAB_0024d604;
                          lVar11 = uVar32 + 1;
                          uVar32 = uVar32 + 1;
                        } while (pWVar24->aLTerm[lVar11]->pExpr != pWVar16->pExpr);
                        bVar9 = false;
                      }
                    }
                    else {
                      if ((uVar7 >> 8 & 1) != 0) {
                        bVar34 = false;
                      }
                      bVar9 = true;
                    }
LAB_0024d604:
                    bVar30 = true;
                    if ((uVar12 & uVar7) == 0) goto LAB_0024d610;
                  }
                  else {
LAB_0024d610:
                    if (pIVar29 == (Index *)0x0) {
                      bVar3 = 0;
                      uVar23 = 0xffffffff;
                    }
                    else {
                      sVar20 = pIVar29->aiColumn[uVar31];
                      bVar3 = pIVar29->aSortOrder[uVar31];
                      if (sVar20 == pIVar29->pTable->iPKey) {
                        sVar20 = -1;
                      }
                      uVar23 = (uint)sVar20;
                    }
                    if ((((uVar6 <= uVar31) && (bVar34)) && (-1 < (int)uVar23)) &&
                       (pIVar29->pTable->aCol[uVar23].notNull == '\0')) {
                      bVar34 = false;
                    }
                    uVar32 = 0;
                    bVar30 = bVar9;
                    if (bVar9) {
                      do {
                        if ((uVar28 >> (uVar32 & 0x3f) & 1) == 0) {
                          pEVar25 = pEVar2[uVar32].pExpr;
                          while ((pEVar25 != (Expr *)0x0 && ((pEVar25->flags >> 0xc & 1) != 0))) {
                            if ((pEVar25->flags >> 0x12 & 1) == 0) {
                              pEVar26 = (ExprList_item *)&pEVar25->pLeft;
                            }
                            else {
                              pEVar26 = ((pEVar25->x).pList)->a;
                            }
                            pEVar25 = pEVar26->pExpr;
                          }
                          if ((wctrlFlags & 0xc0) == 0) {
                            bVar9 = false;
                          }
                          if ((int)uVar23 < -1) {
                            iVar13 = sqlite3ExprCompare((Parse *)0x0,pEVar25,
                                                        pIVar29->aColExpr->a[uVar31].pExpr,iCur);
                            if (iVar13 == 0) goto LAB_0024d755;
                          }
                          else if (((pEVar25->op == 0x98) && (pEVar25->iTable == iCur)) &&
                                  (uVar23 == (int)pEVar25->iColumn)) {
LAB_0024d755:
                            if (-1 < (int)uVar23) {
                              pCVar17 = sqlite3ExprCollSeq(pWInfo->pParse,pEVar2[uVar32].pExpr);
                              if (pCVar17 == (CollSeq *)0x0) {
                                pCVar17 = psVar8->pDfltColl;
                              }
                              iVar13 = sqlite3StrICmp(pCVar17->zName,pIVar29->azColl[uVar31]);
                              if (iVar13 != 0) goto LAB_0024d6a1;
                            }
                            (pWVar24->u).btree.nIdxCol = (short)uVar31 + 1;
                            bVar9 = true;
                            goto LAB_0024d7c8;
                          }
                        }
LAB_0024d6a1:
                        uVar32 = uVar32 + 1;
                        bVar30 = uVar32 < uVar5 && bVar9;
                      } while (bVar30);
                      bVar9 = false;
                    }
                    else {
                      bVar9 = false;
                    }
LAB_0024d7c8:
                    if (((wctrlFlags & 0x40) == 0) && (bVar30)) {
                      if (bVar10) {
                        if ((bVar3 ^ bVar22) != pOrderBy->a[uVar32 & 0xffffffff].sortOrder) {
                          bVar9 = false;
                        }
                        bVar10 = true;
                      }
                      else {
                        bVar4 = pOrderBy->a[uVar32 & 0xffffffff].sortOrder;
                        bVar22 = bVar4 ^ bVar3;
                        bVar10 = true;
                        if (bVar4 != bVar3) {
                          *pRevMask = *pRevMask | 1L << ((byte)uVar19 & 0x3f);
                        }
                      }
                    }
                    if (bVar9) {
                      if (uVar23 == 0xffffffff) {
                        bVar33 = true;
                      }
                      uVar28 = uVar28 | 1L << (uVar32 & 0x3f);
                      bVar30 = true;
                    }
                    else {
                      bVar30 = false;
                      if (uVar31 < local_a8) {
                        bVar34 = bVar30;
                      }
                      if (uVar31 == 0) {
                        bVar34 = false;
                      }
                    }
                  }
                } while ((bVar30) && (uVar31 = uVar31 + 1, uVar31 < uVar14));
                bVar33 = !bVar33;
              }
              bVar33 = (bool)(!bVar34 & bVar33);
            }
            else {
              bVar33 = false;
            }
            if (bVar33) {
              bVar34 = false;
            }
            else {
              local_b8 = local_b8 | pWVar24->maskSelf;
              uVar31 = 0;
              pEVar26 = pEVar2;
              do {
                uVar32 = 1L << ((byte)uVar31 & 0x3f);
                if ((uVar28 >> (uVar31 & 0x3f) & 1) == 0) {
                  pEVar25 = pEVar26->pExpr;
                  BVar18 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar25);
                  if (BVar18 == 0) {
                    local_60.eCode = '\x01';
                    local_60.xExprCallback = exprNodeIsConstant;
                    local_60.xSelectCallback = selectNodeIsConstant;
                    local_60.u.n = 0;
                    if (pEVar25 != (Expr *)0x0) {
                      walkExpr(&local_60,pEVar25);
                    }
                    if (local_60.eCode == '\0') goto LAB_0024d9a4;
                  }
                  if ((~local_b8 & BVar18) != 0) {
                    uVar32 = 0;
                  }
                  uVar28 = uVar28 | uVar32;
                }
LAB_0024d9a4:
                uVar31 = uVar31 + 1;
                pEVar26 = pEVar26 + 1;
              } while (uVar21 != uVar31);
              bVar34 = true;
            }
          }
          if (((!bVar34) || (uVar15 <= uVar28)) ||
             (bVar33 = nLoop <= uVar19, uVar19 = uVar19 + 1, bVar33)) goto LAB_0024da02;
        } while( true );
      }
      bVar34 = true;
      uVar28 = 0;
LAB_0024da02:
      uVar19 = uVar21;
      if ((uVar28 != uVar15) && (uVar19 = 0xff, !bVar34)) {
        uVar12 = (uint)uVar5;
        do {
          uVar12 = uVar12 - 1;
          if ((long)uVar21 < 2) goto LAB_0024da41;
          uVar21 = uVar21 - 1;
        } while ((-1L << ((byte)uVar21 & 0x3f) | uVar28) != 0xffffffffffffffff);
        uVar19 = (ulong)(uVar12 & 0xff);
      }
    }
  }
  else {
LAB_0024da41:
    uVar19 = 0;
  }
  return (i8)uVar19;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        const char *z1, *z2;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z1 = pColl->zName;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pTerm->pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z2 = pColl->zName;
        if( sqlite3StrICmp(z1, z2)!=0 ) continue;
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = -1;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=(-1) ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            if( sqlite3ExprCompare(0,
                  pOBExpr,pIndex->aColExpr->a[j].pExpr,iCur) ){
              continue;
            }
          }
          if( iColumn>=0 ){
            pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( !pColl ) pColl = db->pDfltColl;
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}